

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

TValue * ffi_clib_index(lua_State *L)

{
  ushort uVar1;
  uint uVar2;
  int tt;
  CTypeID CVar3;
  CType *in_RAX;
  TValue *pTVar4;
  long lVar5;
  void *pvVar6;
  int narg;
  CTState *cts;
  ulong uVar7;
  GCstr *key;
  lua_Number lVar8;
  CType *local_38;
  
  pTVar4 = L->base;
  if (((pTVar4 < L->top) && ((pTVar4->field_2).it == 0xfffffff3)) &&
     (uVar7 = (ulong)(pTVar4->u32).lo, *(char *)(uVar7 + 6) == '\x02')) {
    if ((pTVar4 + 1 < L->top) && (*(int *)((long)pTVar4 + 0xc) == -5)) {
      key = (GCstr *)(ulong)pTVar4[1].u32.lo;
      local_38 = in_RAX;
      pTVar4 = lj_tab_setstr(L,*(GCtab **)(uVar7 + 0x20),key);
      if ((pTVar4->field_2).it == 0xffffffff) {
        cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
        cts->L = L;
        CVar3 = lj_ctype_getname(cts,&local_38,key,0x1840);
        if (CVar3 == 0) {
          lj_err_callerv(L,LJ_ERR_FFI_NODECL,key + 1);
        }
        if ((local_38->info & 0xf0000000) == 0xb0000000) {
          uVar2 = local_38->size;
          if (((int)uVar2 < 0 &
              *(byte *)((long)&cts->tab->info + (ulong)((local_38->info & 0xffff) << 4) + 2) >> 7)
              == 1) {
            lVar8 = (lua_Number)uVar2;
          }
          else {
            lVar8 = (lua_Number)(int)uVar2;
          }
          pTVar4->n = lVar8;
        }
        else {
          uVar1 = local_38->sib;
          if (uVar1 != 0) {
            if ((cts->tab[uVar1].info & 0xf0ff0000) == 0x80040000) {
              key = (GCstr *)(ulong)cts->tab[uVar1].name.gcptr32;
            }
          }
          lVar5 = dlsym(*(undefined8 *)(uVar7 + 0x18),key + 1);
          if (lVar5 == 0) {
            clib_error_(L);
          }
          pvVar6 = lj_mem_newgco(cts->L,0x10);
          *(undefined1 *)((long)pvVar6 + 5) = 10;
          *(short *)((long)pvVar6 + 6) = (short)CVar3;
          *(long *)((long)pvVar6 + 8) = lVar5;
          (pTVar4->u32).lo = (uint32_t)pvVar6;
          (pTVar4->field_2).it = 0xfffffff5;
        }
      }
      return pTVar4;
    }
    narg = 2;
    tt = 4;
  }
  else {
    narg = 1;
    tt = 7;
  }
  lj_err_argt(L,narg,tt);
}

Assistant:

static TValue *ffi_clib_index(lua_State *L)
{
  TValue *o = L->base;
  CLibrary *cl;
  if (!(o < L->top && tvisudata(o) && udataV(o)->udtype == UDTYPE_FFI_CLIB))
    lj_err_argt(L, 1, LUA_TUSERDATA);
  cl = (CLibrary *)uddata(udataV(o));
  if (!(o+1 < L->top && tvisstr(o+1)))
    lj_err_argt(L, 2, LUA_TSTRING);
  return lj_clib_index(L, cl, strV(o+1));
}